

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

Vec_Str_t * Abc_SclProduceGenlibStrSimple(SC_Lib *p)

{
  int iVar1;
  Vec_Str_t *p_00;
  undefined8 *puVar2;
  size_t sVar3;
  undefined8 *puVar4;
  char *local_128;
  int local_104;
  int Count;
  int k;
  int j;
  int i;
  SC_Pin *pPinOut;
  SC_Pin *pPin;
  SC_Cell *pCell;
  Vec_Str_t *vStr;
  char Buffer [200];
  SC_Lib *p_local;
  
  Buffer._192_8_ = p;
  p_00 = Vec_StrAlloc(1000);
  Vec_StrPrintStr(p_00,"GATE _const0_            0.00 z=CONST0;\n");
  Vec_StrPrintStr(p_00,"GATE _const1_            0.00 z=CONST1;\n");
  k = 0;
  do {
    iVar1 = Vec_PtrSize((Vec_Ptr_t *)(Buffer._192_8_ + 0x60));
    if (iVar1 <= k) {
      Vec_StrPrintStr(p_00,"\n.end\n");
      Vec_StrPush(p_00,'\0');
      return p_00;
    }
    puVar2 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(Buffer._192_8_ + 0x60),k);
    if (*(int *)(puVar2 + 8) != 0) {
      sVar3 = strlen((char *)*puVar2);
      if (199 < sVar3) {
        __assert_fail("strlen(pCell->pName) < 200",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibUtil.c"
                      ,0x32c,"Vec_Str_t *Abc_SclProduceGenlibStrSimple(SC_Lib *)");
      }
      for (Count = *(int *)(puVar2 + 8); iVar1 = Vec_PtrSize((Vec_Ptr_t *)(puVar2 + 6)),
          Count < iVar1; Count = Count + 1) {
        puVar4 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(puVar2 + 6),Count);
        Vec_StrPrintStr(p_00,"GATE ");
        sprintf((char *)&vStr,"%-16s",*puVar2);
        Vec_StrPrintStr(p_00,(char *)&vStr);
        Vec_StrPrintStr(p_00," ");
        sprintf((char *)&vStr,"%7.2f",(double)*(float *)(puVar2 + 3));
        Vec_StrPrintStr(p_00,(char *)&vStr);
        Vec_StrPrintStr(p_00," ");
        Vec_StrPrintStr(p_00,(char *)*puVar4);
        Vec_StrPrintStr(p_00,"=");
        if (puVar4[5] == 0) {
          local_128 = "?";
        }
        else {
          local_128 = (char *)puVar4[5];
        }
        Vec_StrPrintStr(p_00,local_128);
        Vec_StrPrintStr(p_00,";\n");
        for (local_104 = 0; local_104 < *(int *)(puVar2 + 8); local_104 = local_104 + 1) {
          puVar4 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(puVar2 + 6),local_104);
          Vec_StrPrintStr(p_00,"         PIN ");
          sprintf((char *)&vStr,"%-4s",*puVar4);
          Vec_StrPrintStr(p_00,(char *)&vStr);
          sprintf((char *)&vStr," UNKNOWN  1  999  1.00  0.00  1.00  0.00\n");
          Vec_StrPrintStr(p_00,(char *)&vStr);
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

Vec_Str_t * Abc_SclProduceGenlibStrSimple( SC_Lib * p )
{
    char Buffer[200];
    Vec_Str_t * vStr;
    SC_Cell * pCell;
    SC_Pin * pPin, * pPinOut;
    int i, j, k, Count = 2;
    // mark skipped cells
//    Abc_SclMarkSkippedCells( p );
    vStr = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( vStr, "GATE _const0_            0.00 z=CONST0;\n" );
    Vec_StrPrintStr( vStr, "GATE _const1_            0.00 z=CONST1;\n" );
    SC_LibForEachCell( p, pCell, i )
    {
        if ( pCell->n_inputs == 0 )
            continue;
        assert( strlen(pCell->pName) < 200 );
        SC_CellForEachPinOut( pCell, pPinOut, j )
        {
            Vec_StrPrintStr( vStr, "GATE " );
            sprintf( Buffer, "%-16s", pCell->pName );
            Vec_StrPrintStr( vStr, Buffer );
            Vec_StrPrintStr( vStr, " " );
            sprintf( Buffer, "%7.2f", pCell->area );
            Vec_StrPrintStr( vStr, Buffer );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, pPinOut->pName );
            Vec_StrPrintStr( vStr, "=" );
            Vec_StrPrintStr( vStr, pPinOut->func_text ? pPinOut->func_text : "?" );
            Vec_StrPrintStr( vStr, ";\n" );
            SC_CellForEachPinIn( pCell, pPin, k )
            {
                Vec_StrPrintStr( vStr, "         PIN " );
                sprintf( Buffer, "%-4s", pPin->pName );
                Vec_StrPrintStr( vStr, Buffer );
                sprintf( Buffer, " UNKNOWN  1  999  1.00  0.00  1.00  0.00\n" );
                Vec_StrPrintStr( vStr, Buffer );
            }
            Count++;
        }
    }
    Vec_StrPrintStr( vStr, "\n.end\n" );
    Vec_StrPush( vStr, '\0' );
//    printf( "GENLIB library with %d gates is produced:\n", Count );
//    printf( "%s", Vec_StrArray(vStr) );
    return vStr;
}